

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

double Util::GetCost(MatrixXd *x0,MatrixXd *bias,double Cd)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Scalar SVar4;
  int iVar5;
  PointerType ptr;
  Index index_1;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  Index index;
  int ii;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar16;
  VectorXd prefit_res;
  Vector2d ziter;
  Vector2d bias_iter;
  Vector2d prefit_pred;
  MatrixXd z;
  EGM96Grav gravmodel;
  MatrixXd iau1980;
  MatrixXd nut80;
  scalar_sum_op<double,_double> local_3c9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3c8;
  double local_3b8 [5];
  undefined8 uStack_390;
  EGM96Grav *local_388;
  double dStack_380;
  undefined1 local_378 [64];
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  EGM96Grav *local_298;
  double dStack_290;
  EGM96Grav *local_288;
  double dStack_280;
  EGM96Grav *local_278;
  double dStack_270;
  undefined1 local_268 [24];
  double local_250;
  void *local_248;
  double dStack_240;
  double local_238;
  double *pdStack_230;
  Index local_228;
  Index IStack_220;
  void *local_218;
  double dStack_210;
  double local_208;
  void *pvStack_200;
  double local_1f8;
  double dStack_1f0;
  MatrixXd *local_1e8;
  MatrixXd *local_1e0;
  double local_1d8;
  double *pdStack_1d0;
  double local_1c8;
  MatrixXd local_1c0;
  MatrixXd local_1a8;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_190;
  Propagator local_180;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  double local_38;
  
  pdVar1 = (bias->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_278 = (EGM96Grav *)*pdVar1;
  dStack_270 = pdVar1[1];
  local_288 = (EGM96Grav *)pdVar1[2];
  dStack_280 = pdVar1[3];
  local_298 = (EGM96Grav *)pdVar1[4];
  dStack_290 = pdVar1[5];
  local_3b8[4] = Cd;
  VehicleState::Propagator::Propagator(&local_180);
  local_180.mu_ = 398600.4415;
  local_180.mu_sun_ = 132712440018.0;
  local_180.mu_moon_ = 4902.800066;
  local_180.AU_ = 149597870.7;
  local_180.J2_ = 0.00108248;
  local_180.J3_ = 2.5327e-06;
  local_180.Rearth_ = 6378.1363;
  local_180.earthrotationspeed_ = 7.292115146706979e-05;
  local_180.C_D_ = local_3b8[4];
  local_180.A_ = 10.0;
  local_180.m_ = 2000.0;
  local_180.rho_0_ = 3.614e-13;
  local_180.r0_ = 7078.1363;
  local_180.H_ = 88.667;
  local_180.useJ2_ = true;
  local_180.usedrag_ = true;
  local_180.useSRP_ = true;
  local_180.useLuniSolar_ = true;
  local_180.use20x20_ = true;
  local_1f8 = 0.0;
  dStack_1f0 = 0.0;
  local_208 = 0.0;
  pvStack_200 = (void *)0x0;
  local_218 = (void *)0x0;
  dStack_210 = 0.0;
  local_228 = 0;
  IStack_220 = 0;
  local_238 = 0.0;
  pdStack_230 = (double *)0x0;
  local_248 = (void *)0x0;
  dStack_240 = 0.0;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,"../data/egm96_C_normalized.csv","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d8,"../data/egm96_S_normalized.csv","");
  EGM96Grav::LoadNormCoeffs((EGM96Grav *)(local_268 + 0x10),&local_2b8,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  EGM96Grav::NormCoeffs2Reg((EGM96Grav *)(local_268 + 0x10));
  local_268._16_8_ = local_180.mu_;
  local_250 = local_180.Rearth_;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"../data/nut80.csv","");
  LoadDatFile(&local_1a8,&local_2f8,0x6a,10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"../data/iau1980modifiedHW6.csv","");
  LoadDatFile(&local_1c0,&local_318,0xf,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  pdVar1 = (x0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_180.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = *pdVar1;
  local_180.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = pdVar1[1];
  local_180.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = pdVar1[2];
  local_180.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0]._0_4_ = *(undefined4 *)(pdVar1 + 3);
  local_180.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0]._4_4_ = *(undefined4 *)((long)pdVar1 + 0x1c);
  local_180.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1]._0_4_ = *(undefined4 *)(pdVar1 + 4);
  local_180.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1]._4_4_ = *(undefined4 *)((long)pdVar1 + 0x24);
  local_180.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = pdVar1[5];
  local_180.reltol_ = 3e-12;
  local_180.abstol_ = 1e-14;
  local_180.t_JD_._0_4_ = 0x6f8f5c29;
  local_180.t_JD_._4_4_ = 0x4142c12c;
  local_180.dt_var_._0_4_ = 0x9999999a;
  local_180.dt_var_._4_4_ = 0x3fb99999;
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  local_1e8 = &local_1a8;
  local_1e0 = &local_1c0;
  local_180.gravmodel_ = (EGM96Grav *)(local_268 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_378 + 0x40),"../data/meas_proj_set1.csv","");
  LoadDatFile((MatrixXd *)(local_378 + 0x18),(string *)(local_378 + 0x40),0x1b3,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  dVar16 = *(double *)(local_378._24_8_ + local_378._32_8_ * 2 * 8) / 299792.0;
  uStack_390 = 0;
  local_180.t_ = -dVar16;
  local_3c8.m_storage.m_data = (double *)0x0;
  local_3c8.m_storage.m_rows = 0;
  local_3b8[4] = dVar16;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_3c8,0x366,1);
  if (local_3c8.m_storage.m_rows != 0x366) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_3c8,0x366,1);
  }
  if (0 < local_3c8.m_storage.m_rows) {
    memset(local_3c8.m_storage.m_data,0,local_3c8.m_storage.m_rows << 3);
  }
  iVar5 = (int)*(double *)local_378._24_8_;
  local_3b8[0] = *(double *)(local_378._24_8_ + local_378._32_8_ * 2 * 8);
  local_3b8[1] = *(double *)(local_378._24_8_ + local_378._32_8_ * 3 * 8);
  if (iVar5 == 1) {
    local_388 = local_278;
    dStack_380 = dStack_270;
    dVar16 = 1033.743;
    local_48 = 0x810624dd;
    uStack_44 = 0xc0b7ff95;
    uStack_40 = 0;
    uStack_3c = 0x40955100;
  }
  else if (iVar5 == 2) {
    local_388 = local_288;
    dStack_380 = dStack_280;
    dVar16 = -817.119;
    local_48 = 0x147ae148;
    uStack_44 = 0x409dcd2e;
    uStack_40 = 0x5c28f5c3;
    uStack_3c = 0x40b78ecf;
  }
  else if (iVar5 == 3) {
    local_388 = local_298;
    dStack_380 = dStack_290;
    dVar16 = 1994.578;
    local_48 = 0xb851eb85;
    uStack_44 = 0x40a2ac9e;
    uStack_40 = 0x4bc6a7f0;
    uStack_3c = 0xc0b5bc57;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: bad case in measurement \n",0x20);
    local_48 = extraout_XMM0_Da;
    uStack_44 = extraout_XMM0_Db;
    uStack_40 = extraout_XMM0_Dc;
    uStack_3c = extraout_XMM0_Dd;
  }
  local_378._52_4_ = uStack_44;
  local_378._48_4_ = local_48;
  local_378._60_4_ = uStack_3c;
  local_378._56_4_ = uStack_40;
  local_3b8[3] = dVar16;
  local_38 = dVar16;
  VehicleState::Propagator::GetRangeAndRate
            ((Propagator *)local_378,(Vector3d *)&local_180,local_3b8[4]);
  uVar7 = 2;
  if (((ulong)local_3c8.m_storage.m_data & 7) == 0) {
    uVar7 = (ulong)((uint)((ulong)local_3c8.m_storage.m_data >> 3) & 1);
  }
  uVar6 = (2U - (int)uVar7 & 2) + uVar7;
  if (uVar7 == 0) {
    do {
      auVar3._8_4_ = SUB84(local_3b8[uVar7 + 1] - *(double *)(local_378 + uVar7 * 8 + 8),0);
      auVar3._0_8_ = local_3b8[uVar7] - *(double *)(local_378 + uVar7 * 8);
      auVar3._12_4_ =
           (int)((ulong)(local_3b8[uVar7 + 1] - *(double *)(local_378 + uVar7 * 8 + 8)) >> 0x20);
      *(undefined1 (*) [16])(local_3c8.m_storage.m_data + uVar7) = auVar3;
      uVar7 = uVar7 + 2;
    } while (uVar7 < uVar6);
  }
  else {
    uVar11 = 0;
    do {
      local_3c8.m_storage.m_data[uVar11] = local_3b8[uVar11] - *(double *)(local_378 + uVar11 * 8);
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
  }
  if ((uint)uVar6 < 2) {
    do {
      local_3c8.m_storage.m_data[uVar6] = local_3b8[uVar6] - *(double *)(local_378 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 2);
  }
  lVar9 = 1;
  lVar13 = 0x10;
  lVar10 = 0;
  do {
    local_3b8[4] = *(double *)(local_378._24_8_ + (local_378._32_8_ * 2 + lVar9) * 8) / 299792.0;
    VehicleState::Propagator::Propagate
              (&local_180,
               (*(double *)(local_378._24_8_ + (local_378._32_8_ + lVar9) * 8) - local_3b8[4]) -
               *(double *)(local_378._24_8_ + (local_378._32_8_ + lVar9 + -1) * 8),false);
    iVar5 = (int)*(double *)(local_378._24_8_ + lVar9 * 8);
    if (iVar5 == 1) {
      local_388 = local_278;
      dStack_380 = dStack_270;
      local_378._48_8_ = -6143.584;
      local_378._56_8_ = (double *)0x4095510000000000;
      uVar14 = 0xd4fdf3b6;
      uVar15 = 0x409026f8;
LAB_001134cf:
      local_3b8[3] = (double)CONCAT44(uVar15,uVar14);
    }
    else {
      if (iVar5 == 2) {
        local_388 = local_288;
        dStack_380 = dStack_280;
        local_378._48_8_ = 1907.295;
        local_378._56_8_ = (double *)0x40b78ecf5c28f5c3;
        uVar14 = 0xb645a1cb;
        uVar15 = 0xc08988f3;
        goto LAB_001134cf;
      }
      if (iVar5 == 3) {
        local_388 = local_298;
        dStack_380 = dStack_290;
        local_378._48_8_ = 2390.31;
        local_378._56_8_ = (double *)0xc0b5bc574bc6a7f0;
        uVar14 = 0xdf3b645a;
        uVar15 = 0x409f2a4f;
        goto LAB_001134cf;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: bad case in measurement \n",0x20);
    }
    local_1d8 = (double)local_378._48_8_;
    pdStack_1d0 = (double *)local_378._56_8_;
    local_1c8 = local_3b8[3];
    VehicleState::Propagator::GetRangeAndRate
              ((Propagator *)local_268,(Vector3d *)&local_180,local_3b8[4]);
    local_378._0_8_ = local_268._0_8_;
    local_378._8_8_ = local_268._8_8_;
    local_3b8[0] = *(double *)(local_378._24_8_ + (lVar9 + local_378._32_8_ * 2) * 8);
    local_3b8[1] = *(double *)(local_378._24_8_ + (lVar9 + local_378._32_8_ * 3) * 8);
    uVar7 = (ulong)((uint)((ulong)local_3c8.m_storage.m_data >> 3) & 1);
    if (((ulong)local_3c8.m_storage.m_data & 7) != 0) {
      uVar7 = 2;
    }
    uVar11 = (ulong)(2U - (int)uVar7 & 2);
    uVar6 = uVar11 + uVar7;
    if (uVar7 == 0) {
      uVar12 = 0;
      do {
        dVar16 = (local_3b8[uVar12 + 1] - *(double *)(local_378 + uVar12 * 8 + 8)) -
                 (&dStack_380)[uVar12];
        auVar2._8_4_ = SUB84(dVar16,0);
        auVar2._0_8_ = (local_3b8[uVar12] - *(double *)(local_378 + uVar12 * 8)) -
                       (double)(&local_388)[uVar12];
        auVar2._12_4_ = (int)((ulong)dVar16 >> 0x20);
        *(undefined1 (*) [16])((long)local_3c8.m_storage.m_data + uVar12 * 8 + lVar10 + 0x10) =
             auVar2;
        uVar12 = uVar12 + 2;
      } while (uVar12 < uVar6);
    }
    else {
      uVar12 = 0;
      do {
        *(double *)((long)local_3c8.m_storage.m_data + uVar12 * 8 + lVar13) =
             (local_3b8[uVar12] - *(double *)(local_378 + uVar12 * 8)) -
             (double)(&local_388)[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar7 != uVar12);
    }
    if ((uint)uVar6 < 2) {
      lVar8 = uVar7 + uVar11 + -2;
      do {
        *(double *)((long)local_3c8.m_storage.m_data + lVar8 * 8 + lVar10 + 0x20) =
             (local_3b8[lVar8 + 2] - *(double *)(local_378 + lVar8 * 8 + 0x10)) -
             *(double *)(local_378 + lVar8 * 8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
    }
    VehicleState::Propagator::Propagate(&local_180,local_3b8[4],false);
    lVar9 = lVar9 + 1;
    lVar13 = lVar13 + 0x10;
    lVar10 = lVar10 + 0x10;
    if (lVar9 == 0x1b3) {
      local_190.m_xpr = (XprTypeNested)&local_3c8;
      if (local_3c8.m_storage.m_rows == 0) {
        uVar14 = 0;
        uVar15 = 0;
      }
      else {
        local_268._8_8_ = local_3c8.m_storage.m_data;
        SVar4 = Eigen::internal::
                redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                ::
                run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                          ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)local_268,&local_3c9,&local_190);
        uVar14 = SUB84(SVar4,0);
        uVar15 = (undefined4)((ulong)SVar4 >> 0x20);
      }
      local_3b8[4] = SQRT((double)CONCAT44(uVar15,uVar14));
      free(local_3c8.m_storage.m_data);
      free((void *)local_378._24_8_);
      free(local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(pvStack_200);
      free(local_218);
      free(pdStack_230);
      free(local_248);
      free(local_180.STM_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data);
      return local_3b8[4];
    }
  } while( true );
}

Assistant:

double GetCost(Eigen::MatrixXd x0, Eigen::MatrixXd bias, double Cd){

		//extract bias
		Eigen::Vector2d bias1 = bias.block(0,0,2,1);
		Eigen::Vector2d bias2 = bias.block(2,0,2,1);
		Eigen::Vector2d bias3 = bias.block(4,0,2,1);

		//form a propagator object
		VehicleState::Propagator propobj;

		//set physics constants
		propobj.mu_ = 398600.4415; // km^3/sec^2
		propobj.mu_sun_ = 132712440018.0; //km^3/sec^2
		propobj.mu_moon_ = 4902.800066; //km^3/sec^2
		propobj.AU_ = 149597870.7;
		propobj.J2_ = 0.00108248;
		propobj.J3_ = 0.0000025327;
		propobj.Rearth_ = 6378.1363; //km
		propobj.earthrotationspeed_ = 7.292115146706979 * pow(10.0,-5.0); // rad/sec
		propobj.C_D_ = Cd;
		propobj.A_ = 10.0; // m^2
		propobj.m_ = 2000.0; //kg
		propobj.rho_0_ = 3.614*pow(10.0,-13.0); //kg/m^3
		propobj.r0_ = 700.0 + propobj.Rearth_; //km
		propobj.H_ = 88.6670; //km

		double c = 299792.0; //speed of light km/sec

		//parameters
		propobj.useJ2_ = true;
		propobj.use20x20_ = true;
		propobj.usedrag_ = true;
		propobj.useSRP_ = true;
		propobj.useLuniSolar_ = true; //gravity of sun and moon

		//form a gravity object
		Util::EGM96Grav gravmodel;
		gravmodel.LoadNormCoeffs("../data/egm96_C_normalized.csv", "../data/egm96_S_normalized.csv");
		gravmodel.NormCoeffs2Reg();
		gravmodel.mu_ = propobj.mu_;
		gravmodel.Rearth_ = propobj.Rearth_;
		Eigen::MatrixXd nut80 = Util::LoadDatFile("../data/nut80.csv", 106, 10);
		Eigen::MatrixXd iau1980 = Util::LoadDatFile("../data/iau1980modifiedHW6.csv",15, 4);
		gravmodel.nut80ptr_ = &nut80; 
		gravmodel.iau1980ptr_ = &iau1980;
		propobj.gravmodel_ = &gravmodel;

		//set objects position and velocity
		Eigen::Vector3d pos0;
		pos0[0] = x0(0,0);
		pos0[1] = x0(1,0);
		pos0[2] = x0(2,0);

		Eigen::Vector3d vel0;
		vel0[0] = x0(3,0);
		vel0[1] = x0(4,0);
		vel0[2] = x0(5,0);

		//set observation station ECEF location
		Eigen::Vector3d obs_station1{-6143.584, 1364.250, 1033.743}; //atoll / Kwajalein
		Eigen::Vector3d obs_station2{1907.295, 6030.810, -817.119}; //diego garcia
		Eigen::Vector3d obs_station3{2390.310, -5564.341, 1994.578}; //arecibo

		propobj.pos_ = pos0;
		propobj.vel_ = vel0;
		propobj.t_JD_ = Util::JulianDateNatural2JD(2018.0, 3.0, 23.0, 8.0, 55.0, 3.0);

		//set tolerance options
		// propobj.abstol_ = 1.0*pow(10.0,-16.0);
		// propobj.reltol_ = 3.0*pow(10.0,-14.0);
		// propobj.dt_var_ = 0.1;
		propobj.abstol_ = 1.0*pow(10.0,-14.0);
		propobj.reltol_ = 3.0*pow(10.0,-12.0);
		propobj.dt_var_ = 0.1;

		// timing
		double dt; //seconds for propagation
		int N = 435; // number of measurements
		// int N = 150; // number of measurements

		//load the measurements
		Eigen::MatrixXd z = Util::LoadDatFile("../data/meas_proj_set1.csv",N,4);

		//process the first measurement outside the loop
		double tof = z(0,2)/c;

		//start at the predicted time
		propobj.t_ = -1.0*tof;

		//initialize data storage
		Eigen::VectorXd prefit_res = Eigen::VectorXd::Zero(2*N,1);

		//detirmine which tracking station was used
		int stationID = (int) z(0, 0);

		//measurement
		Eigen::Vector2d ziter = z.block(0,2,1,2).transpose();

		//get the station position
		Eigen::Vector3d obs_station_iter;
		Eigen::Vector2d bias_iter;
		switch(stationID) {
			case 1:
				obs_station_iter = obs_station1;
				bias_iter = bias1;
				break;

			case 2:
				obs_station_iter = obs_station2;
				bias_iter = bias2;
				break;

			case 3:
				obs_station_iter = obs_station3;
				bias_iter = bias3;
				break;

			default: std::cout << "Error: bad case in measurement \n";
		}

		//residual calculation
		Eigen::Vector2d prefit_pred = propobj.GetRangeAndRate(obs_station_iter, tof);

		//store data
		prefit_res.segment(0,2) = ziter - prefit_pred;

		// propagate starting with the second measurement
		for (int ii = 1; ii < N; ++ii){

			//get this measurement time of flight
			tof = z(ii,2)/c;

			//get the time we need to propagate to get to this measurement
			dt = z(ii,1) - tof - z(ii-1,1);

			//propagate
			propobj.Propagate(dt,false);

			//determine which tracking station was used
			stationID = (int) z(ii, 0);

			switch(stationID) {
				case 1:
					obs_station_iter = obs_station1;
					bias_iter = bias1;
					break;

				case 2:
					obs_station_iter = obs_station2;
					bias_iter = bias2;
					break;

				case 3:
					obs_station_iter = obs_station3;
					bias_iter = bias3;
					break;

				default: std::cout << "Error: bad case in measurement \n";
			}

			//assign estimate to propobj for residual calculation
			prefit_pred = propobj.GetRangeAndRate(obs_station_iter, tof);

			//measurement
			ziter = z.block(ii,2,1,2).transpose();

			//store data
			prefit_res.segment(2*ii,2) = ziter - prefit_pred - bias_iter;

			// Propagate through the TOF
			propobj.Propagate(tof,false);

		}

		//return norm of residuals
		return prefit_res.norm();

	}